

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ismsnoop.cpp
# Opt level: O1

DataType ismsnoop::find_data(ifstream *ifs,int byte_offset,
                            shared_ptr<ismsnoop::VersionHandler> *handler)

{
  pointer __src;
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  DataType DVar5;
  vector<unsigned_int,std::allocator<unsigned_int>> *this;
  void *pvStack_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffer;
  uint local_34 [2];
  uint32_t x;
  
  std::istream::seekg((long)ifs,byte_offset);
  iVar3 = std::istream::tellg();
  this = (vector<unsigned_int,std::allocator<unsigned_int>> *)&pvStack_58;
  pvStack_58 = (void *)0x0;
  buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar4 = 0x80;
  do {
    std::istream::read((char *)ifs,(long)local_34);
    if (buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (this,(iterator)
                      buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_start,local_34);
    }
    else {
      *buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = local_34[0];
      buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  do {
    if ((ulong)((long)buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_start - (long)pvStack_58) < 0x3d) {
      DVar5 = None;
      break;
    }
    local_34[0] = 0;
    peVar1 = (handler->super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    iVar4 = (*peVar1->_vptr_VersionHandler[1])(peVar1,&pvStack_58,local_34);
    if ((char)iVar4 == '\0') {
      peVar1 = (handler->super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      iVar4 = (*peVar1->_vptr_VersionHandler[2])(peVar1,&pvStack_58,local_34);
      if ((char)iVar4 == '\0') {
        __src = (pointer)((long)pvStack_58 + 4);
        if (__src != buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start) {
          memmove(pvStack_58,__src,
                  (long)buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start - (long)__src);
        }
        buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + -1;
        bVar2 = true;
      }
      else {
        bVar2 = false;
        std::istream::seekg((long)ifs,
                            ((iVar3 + 0x200) -
                            (int)buffer.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) + local_34[0] * 4 +
                            (int)pvStack_58);
        this = (vector<unsigned_int,std::allocator<unsigned_int>> *)0x2;
      }
    }
    else {
      bVar2 = false;
      std::istream::seekg((long)ifs,
                          ((iVar3 + 0x200) -
                          (int)buffer.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) + local_34[0] * 4 +
                          (int)pvStack_58);
      this = (vector<unsigned_int,std::allocator<unsigned_int>> *)0x1;
    }
    DVar5 = (DataType)this;
  } while (bVar2);
  if (pvStack_58 != (void *)0x0) {
    operator_delete(pvStack_58);
  }
  return DVar5;
}

Assistant:

static DataType find_data(std::ifstream & ifs, int byte_offset, std::shared_ptr<VersionHandler> handler)
{
	ifs.seekg(byte_offset, std::ios::cur);

	auto start = ifs.tellg();

	std::vector<uint32_t> buffer;

	for (int i = 0; i < 128; i++)
	{
		uint32_t x;
		ifs.read((char*)(&x), 4);
		buffer.push_back(x);
	}

	while (buffer.size() > 15)
	{
		int next = 0;

		if (handler->looks_like_a_background_image(buffer, &next))
		{
			ifs.seekg(start + (std::streampos((next * 4) + ((128 - buffer.size()) * 4))), std::ios::beg);
			return DataType::BackgroundImage;
		}

		if (handler->looks_like_the_info_text(buffer, &next))
		{
			ifs.seekg(start + (std::streampos((next * 4) + ((128 - buffer.size()) * 4))), std::ios::beg);
			return DataType::InfoText;
		}

		buffer.erase(buffer.begin());
	}

	return DataType::None;
}